

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O2

void CuFail_Line(CuTest *tc,char *file,int line,char *message2,char *message)

{
  CuString string;
  CuString local_40;
  
  CuStringInit(&local_40);
  if (message2 != (char *)0x0) {
    CuStringAppend(&local_40,message2);
    CuStringAppend(&local_40,": ");
  }
  CuStringAppend(&local_40,message);
  CuFailInternal(tc,file,line,&local_40);
  return;
}

Assistant:

void CuFail_Line(CuTest* tc, const char* file, int line, const char* message2, const char* message)
{
	CuString string;

	CuStringInit(&string);
	if (message2 != NULL)
	{
		CuStringAppend(&string, message2);
		CuStringAppend(&string, ": ");
	}
	CuStringAppend(&string, message);
	CuFailInternal(tc, file, line, &string);
}